

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O1

void __thiscall
Triangle_Reintersect_Test::~Triangle_Reintersect_Test(Triangle_Reintersect_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Triangle, Reintersect) {
    for (int i = 0; i < 1000; ++i) {
        RNG rng(i);
        ShapeHandle tri = GetRandomTriangle([&]() { return pExp(rng); });
        if (!tri)
            continue;

        // Sample a point on the triangle surface to shoot the ray toward.
        Point2f u;
        u[0] = rng.Uniform<Float>();
        u[1] = rng.Uniform<Float>();
        auto ts = tri.Sample(u);
        ASSERT_TRUE(ts.has_value());

        // Choose a ray origin.
        Point3f o;
        for (int j = 0; j < 3; ++j)
            o[j] = pExp(rng);

        // Intersect the ray with the triangle.
        Ray r(o, ts->intr.p() - o);
        auto si = tri.Intersect(r);
        if (!si)
            // We should almost always find an intersection, but rarely
            // miss, due to round-off error. Just do another go-around in
            // this case.
            continue;
        SurfaceInteraction &isect = si->intr;

        // Now trace a bunch of rays leaving the intersection point.
        for (int j = 0; j < 1000; ++j) {
            // Random direction leaving the intersection point.
            Point2f u;
            u[0] = rng.Uniform<Float>();
            u[1] = rng.Uniform<Float>();
            Vector3f w = SampleUniformSphere(u);
            Ray rOut = isect.SpawnRay(w);
            EXPECT_FALSE(tri.IntersectP(rOut));
            EXPECT_FALSE(tri.Intersect(rOut).has_value());

            // Choose a random point to trace rays to.
            Point3f p2;
            for (int k = 0; k < 3; ++k)
                p2[k] = pExp(rng);
            rOut = isect.SpawnRayTo(p2);

            EXPECT_FALSE(tri.IntersectP(rOut, 1));
            EXPECT_FALSE(tri.Intersect(rOut, 1).has_value());
        }
    }
}